

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBar::removeTab(QTabBar *this,int index)

{
  undefined1 *rect;
  int iVar1;
  SelectionBehavior SVar2;
  QTabBarPrivate *this_00;
  Tab *this_01;
  long lVar3;
  Tab **ppTVar4;
  long lVar5;
  long *plVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QRect QVar11;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (index < 0) goto LAB_0049431f;
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar10 = (ulong)(uint)index;
  if ((ulong)(this_00->tabList).d.size <= uVar10) goto LAB_0049431f;
  this_01 = (this_00->tabList).d.ptr[uVar10];
  if ((this_00->field_0x2d1 & 2) != 0) {
    QTabBarPrivate::moveTabFinished(this_00,this_00->pressedIndex);
  }
  QWidget::releaseShortcut(&this->super_QWidget,(this_00->tabList).d.ptr[uVar10]->shortcutId);
  if (this_01->leftWidget != (QWidget *)0x0) {
    QWidget::hide(this_01->leftWidget);
    QObject::deleteLater();
    this_01->leftWidget = (QWidget *)0x0;
  }
  if (this_01->rightWidget != (QWidget *)0x0) {
    QWidget::hide(this_01->rightWidget);
    QObject::deleteLater();
    this_01->rightWidget = (QWidget *)0x0;
  }
  uVar9 = this_01->lastTab;
  QList<QTabBarPrivate::Tab_*>::removeAt(&this_00->tabList,uVar10);
  if (this_01 != (Tab *)0x0) {
    QTabBarPrivate::Tab::~Tab(this_01);
    operator_delete(this_01,0xf0);
  }
  lVar3 = (this_00->tabList).d.size;
  if (lVar3 != 0) {
    ppTVar4 = (this_00->tabList).d.ptr;
    lVar8 = 0;
    do {
      lVar5 = *(long *)((long)ppTVar4 + lVar8);
      if (*(int *)(lVar5 + 0xdc) == index) {
        *(undefined4 *)(lVar5 + 0xdc) = 0xffffffff;
      }
      if (index < *(int *)(lVar5 + 0xdc)) {
        *(int *)(lVar5 + 0xdc) = *(int *)(lVar5 + 0xdc) + -1;
      }
      lVar8 = lVar8 + 8;
    } while (lVar3 << 3 != lVar8);
  }
  QTabBarPrivate::calculateFirstLastVisible(this_00,index,false,true);
  iVar1 = this_00->currentIndex;
  if (iVar1 == index) {
    this_00->currentIndex = -1;
    if ((this_00->tabList).d.size != 0) {
      SVar2 = this_00->selectionBehaviorOnRemove;
      if (SVar2 == SelectLeftTab) {
        uVar7 = index - 1;
LAB_004941d0:
        if (this_00->lastVisible < (int)uVar7) {
          uVar7 = this_00->lastVisible;
        }
        if ((int)uVar7 < this_00->firstVisible) {
          uVar7 = this_00->firstVisible;
        }
        uVar10 = (ulong)uVar7;
      }
      else {
        uVar10 = (ulong)uVar9;
        uVar7 = index;
        if (SVar2 == SelectRightTab) goto LAB_004941d0;
        if (SVar2 == SelectPreviousTab) {
          uVar9 = uVar9 - (index < (int)uVar9);
          uVar10 = (ulong)uVar9;
          if ((((int)uVar9 < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)uVar9)) ||
             (((this_00->tabList).d.ptr[uVar9]->field_0xe4 & 2) == 0)) goto LAB_004941d0;
        }
      }
      if ((-1 < (int)uVar10) && (uVar10 < (ulong)(this_00->tabList).d.size)) {
        iVar1 = (this_00->tabList).d.ptr[uVar10]->lastTab;
        setCurrentIndex(this,(int)uVar10);
        (this_00->tabList).d.ptr[uVar10]->lastTab = iVar1;
        goto LAB_0049425c;
      }
    }
    puStack_40 = &local_4c;
    local_4c = 0xffffffff;
    local_48 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
  }
  else if (index < iVar1) {
    setCurrentIndex(this,iVar1 + -1);
  }
LAB_0049425c:
  QTabBarPrivate::refresh(this_00);
  if ((this_00->field_0x2d1 & 8) != 0) {
    plVar6 = *(long **)&(this_00->super_QWidgetPrivate).field_0x8;
    (**(code **)(*plVar6 + 0x68))(plVar6,1 < *(int *)(plVar6[1] + 0x2e8));
  }
  if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c) &&
     (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
    rect = &(this_00->super_QWidgetPrivate).field_0x254;
    QWidget::update(&this->super_QWidget,(QRect *)rect);
    uVar9 = tabAt(this,&this_00->mousePosition);
    this_00->hoverIndex = uVar9;
    if (((int)uVar9 < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)uVar9)) {
      *(undefined8 *)rect = 0;
      *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
    }
    else {
      QVar11 = tabRect(this,uVar9);
      *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar11;
      QWidget::update(&this->super_QWidget,(QRect *)rect);
    }
  }
  (**(code **)(*(long *)&this->super_QWidget + 0x1b8))(this,index);
LAB_0049431f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBar::removeTab(int index)
{
    Q_D(QTabBar);
    if (d->validIndex(index)) {
        auto removedTab = d->tabList.at(index);
        if (d->dragInProgress)
            d->moveTabFinished(d->pressedIndex);

#ifndef QT_NO_SHORTCUT
        releaseShortcut(d->tabList.at(index)->shortcutId);
#endif
        if (removedTab->leftWidget) {
            removedTab->leftWidget->hide();
            removedTab->leftWidget->deleteLater();
            removedTab->leftWidget = nullptr;
        }
        if (removedTab->rightWidget) {
            removedTab->rightWidget->hide();
            removedTab->rightWidget->deleteLater();
            removedTab->rightWidget = nullptr;
        }

        int newIndex = removedTab->lastTab;
        d->tabList.removeAt(index);
        delete removedTab;
        for (auto tab : std::as_const(d->tabList)) {
            if (tab->lastTab == index)
                tab->lastTab = -1;
            if (tab->lastTab > index)
                --tab->lastTab;
        }

        d->calculateFirstLastVisible(index, false, true);

        if (index == d->currentIndex) {
            // The current tab is going away, in order to make sure
            // we emit that "current has changed", we need to reset this
            // around.
            d->currentIndex = -1;
            if (d->tabList.size() > 0) {
                switch(d->selectionBehaviorOnRemove) {
                case SelectPreviousTab:
                    if (newIndex > index)
                        newIndex--;
                    if (d->validIndex(newIndex) && d->tabList.at(newIndex)->visible)
                        break;
                    Q_FALLTHROUGH();
                case SelectRightTab:
                    newIndex = qBound(d->firstVisible, index, d->lastVisible);
                    break;
                case SelectLeftTab:
                    newIndex = qBound(d->firstVisible, index-1, d->lastVisible);
                    break;
                default:
                    break;
                }

                if (d->validIndex(newIndex)) {
                    // don't loose newIndex's old through setCurrentIndex
                    int bump = d->tabList.at(newIndex)->lastTab;
                    setCurrentIndex(newIndex);
                    d->tabList.at(newIndex)->lastTab = bump;
                } else {
                    // we had a valid current index, but there are no visible tabs left
                    emit currentChanged(-1);
                }
            } else {
                emit currentChanged(-1);
            }
        } else if (index < d->currentIndex) {
            setCurrentIndex(d->currentIndex - 1);
        }
        d->refresh();
        d->autoHideTabs();
        if (d->hoverRect.isValid()) {
            update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        tabRemoved(index);
    }
}